

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O1

int Of_CutDeref_rec(Of_Man_t *p,int *pCut)

{
  int *piVar1;
  Of_Obj_t *pOVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  
  iVar3 = 1;
  if ((p->Iter & 1) == 0) {
    iVar3 = 0;
    if (1 < (*pCut & 0x1fU)) {
      iVar3 = (*pCut & 0x1fU) + p->pPars->nAreaTuner;
    }
  }
  if ((*pCut & 0x1f) != 0) {
    uVar7 = 0;
    do {
      uVar4 = pCut[uVar7 + 1];
      if ((int)uVar4 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      if (uVar4 < 2) {
        return iVar3;
      }
      uVar4 = uVar4 >> 1;
      pOVar2 = p->pObjs;
      if (pOVar2[uVar4].iCutH != 0) {
        piVar1 = &pOVar2[uVar4].nRefs;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          if (p->pGia->nObjs <= (int)uVar4) {
            __assert_fail("iObj>0 && iObj<Gia_ManObjNum(p->pGia)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaOf.c"
                          ,0x90,"int *Of_ObjCutBestP(Of_Man_t *, int)");
          }
          uVar6 = pOVar2[uVar4].iCutH >> 0x10;
          if (((int)uVar6 < 0) || ((p->vPages).nSize <= (int)uVar6)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          iVar5 = Of_CutDeref_rec(p,(int *)((ulong)((pOVar2[uVar4].iCutH & 0xffffU) << 2) +
                                           (long)(p->vPages).pArray[uVar6]));
          iVar3 = iVar3 + iVar5;
        }
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < (*pCut & 0x1f));
  }
  return iVar3;
}

Assistant:

int Of_CutDeref_rec( Of_Man_t * p, int * pCut )
{
    int i, Var, Count = (p->Iter & 1) ? 1 : Of_CutArea(p, Of_CutSize(pCut));
    Of_CutForEachVar( pCut, Var, i )
        if ( Of_ObjCutBest(p, Var) && !Of_ObjRefDec(p, Var) )
            Count += Of_CutDeref_rec( p, Of_ObjCutBestP(p, Var) );
    return Count;
}